

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.cpp
# Opt level: O3

void __thiscall rw::Image::makeMask(Image *this)

{
  uint8 *puVar1;
  byte *pbVar2;
  int iVar3;
  long lVar4;
  int iVar5;
  byte bVar6;
  int iVar7;
  byte *pbVar8;
  
  iVar7 = this->depth;
  switch(iVar7 << 0x1e | iVar7 - 4U >> 2) {
  case 0:
  case 1:
    if (iVar7 != 0x1f) {
      lVar4 = 0;
      do {
        puVar1 = this->palette;
        bVar6 = puVar1[lVar4 * 4];
        if (puVar1[lVar4 * 4] < puVar1[lVar4 * 4 + 1]) {
          bVar6 = puVar1[lVar4 * 4 + 1];
        }
        if (bVar6 < puVar1[lVar4 * 4 + 2]) {
          bVar6 = puVar1[lVar4 * 4 + 2];
        }
        puVar1[lVar4 * 4 + 3] = bVar6;
        lVar4 = lVar4 + 1;
      } while (1L << ((byte)iVar7 & 0x3f) != lVar4);
    }
    break;
  case 3:
  case 5:
    convertTo32(this);
  case 7:
    iVar7 = this->height;
    if (0 < iVar7) {
      pbVar2 = this->pixels;
      iVar5 = this->width;
      iVar3 = 0;
      do {
        if (0 < iVar5) {
          iVar7 = 0;
          pbVar8 = pbVar2;
          do {
            bVar6 = *pbVar8;
            if (*pbVar8 < pbVar8[1]) {
              bVar6 = pbVar8[1];
            }
            if (bVar6 < pbVar8[2]) {
              bVar6 = pbVar8[2];
            }
            pbVar8[3] = bVar6;
            pbVar8 = pbVar8 + this->bpp;
            iVar7 = iVar7 + 1;
            iVar5 = this->width;
          } while (iVar7 < iVar5);
          iVar7 = this->height;
        }
        pbVar2 = pbVar2 + this->stride;
        iVar3 = iVar3 + 1;
      } while (iVar3 < iVar7);
    }
  }
  return;
}

Assistant:

void
Image::makeMask(void)
{
	int32 maxcol;
	switch(this->depth){
	case 4:
	case 8: {
		assert(this->palette);
		int32 pallen = 1 << this->depth;
		for(int32 i = 0; i < pallen; i++){
			maxcol = this->palette[i*4+0];
			if(this->palette[i*4+1] > maxcol) maxcol = this->palette[i*4+1];
			if(this->palette[i*4+2] > maxcol) maxcol = this->palette[i*4+2];
			this->palette[i*4+3] = maxcol;
		}
		break;
	}

	case 16:
	case 24:
		this->convertTo32();
		// fallthrough

	case 32: {
		assert(this->pixels);
		uint8 *line = this->pixels;
		uint8 *p;
		for(int32 y = 0; y < this->height; y++){
			p = line;
			for(int32 x = 0; x < this->width; x++){
				maxcol = p[0];
				if(p[1] > maxcol) maxcol = p[1];
				if(p[2] > maxcol) maxcol = p[2];
				p[3] = maxcol;
				p += this->bpp;
			}
			line += this->stride;
		}
		break;
	}
	}
}